

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O0

void __thiscall prometheus::Summary::Observe(Summary *this,double value)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  double value_local;
  Summary *this_local;
  
  lock._M_device = (mutex_type *)value;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  this->count_ = this->count_ + 1;
  this->sum_ = this->sum_ + (double)lock._M_device;
  detail::TimeWindowQuantiles::insert(&this->quantile_values_,(double)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Summary::Observe(const double value) {
  std::lock_guard<std::mutex> lock(mutex_);

  count_ += 1;
  sum_ += value;
  quantile_values_.insert(value);
}